

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O1

int run_test_fork_socketpair(void)

{
  int iVar1;
  uint child_pid;
  int extraout_EAX;
  __pid_t child_pid_00;
  uint uVar2;
  int extraout_EAX_00;
  ssize_t sVar3;
  uint extraout_EDX;
  uv_loop_t *unaff_RBX;
  uv_poll_t *puVar4;
  undefined1 *__buf;
  uv_loop_t *puVar5;
  char *loop;
  int socket_fds [2];
  uv_poll_t poll_handle;
  undefined1 uStack_189;
  int iStack_188;
  uint uStack_184;
  undefined1 auStack_180 [8];
  undefined1 auStack_178 [176];
  uv_loop_t *puStack_c8;
  int local_b0;
  uint local_ac;
  
  run_timer_loop_once();
  puVar5 = (uv_loop_t *)0x1;
  uVar2 = 1;
  iVar1 = socketpair(1,1,0,&local_b0);
  if (iVar1 == 0) {
    puVar5 = uv_default_loop();
    puVar4 = (uv_poll_t *)&stack0xffffffffffffff58;
    iVar1 = uv_poll_init(puVar5,puVar4,local_b0);
    uVar2 = (uint)puVar4;
    if (iVar1 != 0) goto LAB_0015512a;
    child_pid = fork();
    if (child_pid != 0) {
      unaff_RBX = (uv_loop_t *)(ulong)child_pid;
      if (child_pid == 0xffffffff) goto LAB_00155134;
      puVar5 = (uv_loop_t *)(ulong)local_ac;
      uVar2 = 0x1a18c0;
      sVar3 = send(local_ac,"hi\n",3,0);
      if (sVar3 == 3) {
        assert_wait_child(child_pid);
LAB_001550e1:
        unaff_RBX = uv_default_loop();
        uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
        uVar2 = 0;
        uv_run(unaff_RBX,UV_RUN_DEFAULT);
        puVar5 = uv_default_loop();
        iVar1 = uv_loop_close(puVar5);
        if (iVar1 == 0) {
          uv_library_shutdown();
          return 0;
        }
        goto LAB_0015512f;
      }
      goto LAB_00155139;
    }
    puVar5 = uv_default_loop();
    iVar1 = uv_loop_fork(puVar5);
    if (iVar1 != 0) goto LAB_0015513e;
    if (socket_cb_called != 0) goto LAB_00155143;
    puVar5 = (uv_loop_t *)&stack0xffffffffffffff58;
    uVar2 = 1;
    iVar1 = uv_poll_start((uv_poll_t *)puVar5,1,socket_cb);
    if (iVar1 != 0) goto LAB_00155148;
    puts("Going to run the loop in the child");
    puVar5 = uv_default_loop();
    uVar2 = 0;
    iVar1 = uv_run(puVar5,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0015514d;
    if (socket_cb_called == 1) goto LAB_001550e1;
  }
  else {
    run_test_fork_socketpair_cold_1();
LAB_0015512a:
    run_test_fork_socketpair_cold_2();
LAB_0015512f:
    run_test_fork_socketpair_cold_10();
LAB_00155134:
    run_test_fork_socketpair_cold_8();
LAB_00155139:
    run_test_fork_socketpair_cold_9();
LAB_0015513e:
    run_test_fork_socketpair_cold_3();
LAB_00155143:
    run_test_fork_socketpair_cold_4();
LAB_00155148:
    run_test_fork_socketpair_cold_5();
LAB_0015514d:
    run_test_fork_socketpair_cold_6();
  }
  run_test_fork_socketpair_cold_7();
  socket_cb_called = socket_cb_called + 1;
  puStack_c8 = unaff_RBX;
  if (uVar2 == 0) {
    auStack_178._160_8_ = (__pthread_internal_list *)0x155179;
    uVar2 = extraout_EDX;
    printf("Socket cb got events %d\n");
    unaff_RBX = puVar5;
    if ((extraout_EDX & 1) == 0) goto LAB_001551c5;
    if (socket_cb_read_fd == 0) {
LAB_001551b0:
      uv_close((uv_handle_t *)puVar5,(uv_close_cb)0x0);
      return extraout_EAX;
    }
    uVar2 = 0x30f300;
    auStack_178._160_8_ = (__pthread_internal_list *)0x1551a0;
    sVar3 = read(socket_cb_read_fd,socket_cb_read_buf,(ulong)socket_cb_read_size * 3);
    if (sVar3 == (ulong)socket_cb_read_size * 3) goto LAB_001551b0;
  }
  else {
    auStack_178._160_8_ = (__pthread_internal_list *)0x1551c5;
    socket_cb_cold_1();
LAB_001551c5:
    auStack_178._160_8_ = (__pthread_internal_list *)0x1551ca;
    socket_cb_cold_3();
  }
  auStack_178._160_8_ = run_test_fork_socketpair_started;
  socket_cb_cold_2();
  loop = auStack_180;
  auStack_178._160_8_ = unaff_RBX;
  iVar1 = pipe((int *)loop);
  if (iVar1 == 0) {
    run_timer_loop_once();
    loop = (char *)0x1;
    uVar2 = 1;
    iVar1 = socketpair(1,1,0,&iStack_188);
    if (iVar1 != 0) goto LAB_00155430;
    loop = (char *)uv_default_loop();
    puVar4 = (uv_poll_t *)auStack_178;
    iVar1 = uv_poll_init((uv_loop_t *)loop,puVar4,iStack_188);
    uVar2 = (uint)puVar4;
    if (iVar1 != 0) goto LAB_00155435;
    loop = auStack_178;
    uVar2 = 1;
    iVar1 = uv_poll_start((uv_poll_t *)loop,1,socket_cb);
    if (iVar1 != 0) goto LAB_0015543a;
    loop = (char *)uv_default_loop();
    uVar2 = 2;
    iVar1 = uv_run((uv_loop_t *)loop,UV_RUN_NOWAIT);
    if (iVar1 != 1) goto LAB_0015543f;
    child_pid_00 = fork();
    if (child_pid_00 != 0) {
      if (child_pid_00 == -1) goto LAB_00155449;
      loop = auStack_178;
      iVar1 = uv_poll_stop((uv_poll_t *)loop);
      if (iVar1 != 0) goto LAB_0015544e;
      uv_close((uv_handle_t *)auStack_178,(uv_close_cb)0x0);
      loop = (char *)uv_default_loop();
      uVar2 = 0;
      iVar1 = uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
      if (iVar1 != 0) goto LAB_00155458;
      if (socket_cb_called != 0) goto LAB_00155462;
      loop = (char *)(ulong)(uint)auStack_180._4_4_;
      uVar2 = 0x1a23e5;
      sVar3 = write(auStack_180._4_4_,"1",1);
      if (sVar3 != 1) goto LAB_0015546c;
      loop = (char *)(ulong)uStack_184;
      uVar2 = 0x1a18c0;
      sVar3 = send(uStack_184,"hi\n",3,0);
      if (sVar3 != 3) goto LAB_00155476;
      loop = (char *)uv_default_loop();
      uVar2 = 0;
      iVar1 = uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
      if (iVar1 == 0) {
        if (socket_cb_called != 0) goto LAB_0015548a;
        assert_wait_child(child_pid_00);
        goto LAB_001553e7;
      }
      goto LAB_00155480;
    }
    uVar2 = getpid();
    printf("Child is %d\n",(ulong)uVar2);
    loop = (char *)(ulong)(uint)auStack_180._0_4_;
    __buf = &uStack_189;
    sVar3 = read(auStack_180._0_4_,__buf,1);
    uVar2 = (uint)__buf;
    if (sVar3 != 1) goto LAB_00155453;
    loop = (char *)uv_default_loop();
    iVar1 = uv_loop_fork((uv_loop_t *)loop);
    if (iVar1 != 0) goto LAB_0015545d;
    if (socket_cb_called != 0) goto LAB_00155467;
    puts("Going to run the loop in the child");
    socket_cb_read_fd = iStack_188;
    socket_cb_read_size = 1;
    loop = (char *)uv_default_loop();
    uVar2 = 0;
    iVar1 = uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00155471;
    if (socket_cb_called != 1) goto LAB_0015547b;
    loop = "Buf %s\n";
    uVar2 = 0x30f300;
    printf("Buf %s\n");
    if (socket_cb_read_buf._0_4_ == 0xa6968) {
LAB_001553e7:
      puVar5 = uv_default_loop();
      uv_walk(puVar5,close_walk_cb,(void *)0x0);
      uVar2 = 0;
      uv_run(puVar5,UV_RUN_DEFAULT);
      loop = (char *)uv_default_loop();
      iVar1 = uv_loop_close((uv_loop_t *)loop);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_00155444;
    }
  }
  else {
    run_test_fork_socketpair_started_cold_1();
LAB_00155430:
    run_test_fork_socketpair_started_cold_2();
LAB_00155435:
    run_test_fork_socketpair_started_cold_3();
LAB_0015543a:
    run_test_fork_socketpair_started_cold_4();
LAB_0015543f:
    run_test_fork_socketpair_started_cold_5();
LAB_00155444:
    run_test_fork_socketpair_started_cold_20();
LAB_00155449:
    run_test_fork_socketpair_started_cold_12();
LAB_0015544e:
    run_test_fork_socketpair_started_cold_13();
LAB_00155453:
    run_test_fork_socketpair_started_cold_6();
LAB_00155458:
    run_test_fork_socketpair_started_cold_14();
LAB_0015545d:
    run_test_fork_socketpair_started_cold_7();
LAB_00155462:
    run_test_fork_socketpair_started_cold_15();
LAB_00155467:
    run_test_fork_socketpair_started_cold_8();
LAB_0015546c:
    run_test_fork_socketpair_started_cold_16();
LAB_00155471:
    run_test_fork_socketpair_started_cold_9();
LAB_00155476:
    run_test_fork_socketpair_started_cold_17();
LAB_0015547b:
    run_test_fork_socketpair_started_cold_10();
LAB_00155480:
    run_test_fork_socketpair_started_cold_18();
  }
  run_test_fork_socketpair_started_cold_11();
LAB_0015548a:
  run_test_fork_socketpair_started_cold_19();
  fork_signal_cb_called = uVar2;
  uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(fork_socketpair) {
  /* A socket opened in the parent and accept'd in the
     child works after a fork. */
  pid_t child_pid;
  int socket_fds[2];
  uv_poll_t poll_handle;

  /* Prime the loop. */
  run_timer_loop_once();

  ASSERT(0 == socketpair(AF_UNIX, SOCK_STREAM, 0, socket_fds));

  /* Create the server watcher in the parent, use it in the child. */
  ASSERT(0 == uv_poll_init(uv_default_loop(), &poll_handle, socket_fds[0]));

  child_pid = fork();
  ASSERT(child_pid != -1);

  if (child_pid != 0) {
    /* parent */
    ASSERT(3 == send(socket_fds[1], "hi\n", 3, 0));
    assert_wait_child(child_pid);
  } else {
    /* child */
    ASSERT(0 == uv_loop_fork(uv_default_loop()));
    ASSERT(0 == socket_cb_called);
    ASSERT(0 == uv_poll_start(&poll_handle, UV_READABLE, socket_cb));
    printf("Going to run the loop in the child\n");
    ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
    ASSERT(1 == socket_cb_called);
  }

  MAKE_VALGRIND_HAPPY();
  return 0;
}